

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TtHieManStop(Abc_TtHieMan_t *p)

{
  Vec_Mem_t *pVVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  if (-1 < p->nLastLevel) {
    lVar6 = 0;
    do {
      pVVar1 = p->vTtMem[lVar6];
      if (pVVar1 != (Vec_Mem_t *)0x0) {
        if (pVVar1->vTable != (Vec_Int_t *)0x0) {
          piVar2 = pVVar1->vTable->pArray;
          if (piVar2 != (int *)0x0) {
            free(piVar2);
            pVVar1->vTable->pArray = (int *)0x0;
          }
          if (pVVar1->vTable != (Vec_Int_t *)0x0) {
            free(pVVar1->vTable);
            pVVar1->vTable = (Vec_Int_t *)0x0;
          }
        }
        if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
          piVar2 = pVVar1->vNexts->pArray;
          if (piVar2 != (int *)0x0) {
            free(piVar2);
            pVVar1->vNexts->pArray = (int *)0x0;
          }
          if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
            free(pVVar1->vNexts);
            pVVar1->vNexts = (Vec_Int_t *)0x0;
          }
        }
      }
      pVVar1 = p->vTtMem[lVar6];
      if (pVVar1 != (Vec_Mem_t *)0x0) {
        if (-1 < pVVar1->iPage) {
          lVar5 = -1;
          do {
            if (pVVar1->ppPages[lVar5 + 1] != (word *)0x0) {
              free(pVVar1->ppPages[lVar5 + 1]);
              pVVar1->ppPages[lVar5 + 1] = (word *)0x0;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < pVVar1->iPage);
        }
        if (pVVar1->ppPages != (word **)0x0) {
          free(pVVar1->ppPages);
          pVVar1->ppPages = (word **)0x0;
        }
        free(pVVar1);
        p->vTtMem[lVar6] = (Vec_Mem_t *)0x0;
      }
      pVVar3 = p->vRepres[lVar6];
      if (pVVar3->pArray != (int *)0x0) {
        free(pVVar3->pArray);
        pVVar3->pArray = (int *)0x0;
      }
      if (pVVar3 != (Vec_Int_t *)0x0) {
        free(pVVar3);
      }
      bVar4 = lVar6 < p->nLastLevel;
      lVar6 = lVar6 + 1;
    } while (bVar4);
  }
  pVVar3 = p->vPhase;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  free(p);
  return;
}

Assistant:

void Abc_TtHieManStop(Abc_TtHieMan_t * p)
{
    int i;
    for (i = 0; i <= p->nLastLevel; i++)
    {
        Vec_MemHashFree(p->vTtMem[i]);
        Vec_MemFreeP(&p->vTtMem[i]);
        Vec_IntFree(p->vRepres[i]);
    }
    Vec_IntFree( p->vPhase );
    ABC_FREE(p);
}